

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorLineEdit.h
# Opt level: O3

void __thiscall QColorLineEdit::~QColorLineEdit(QColorLineEdit *this)

{
  QAbstractButtonLineEditPrivate **this_00;
  
  this_00 = &this[-1].super_QAbstractButtonLineEdit.d;
  QLineEdit::~QLineEdit((QLineEdit *)this_00);
  operator_delete(this_00,0x38);
  return;
}

Assistant:

class QT_WIDGETS_EXTRA_QT_WIDGETS_EXTRA_LIB_EXPORT QColorLineEdit : public QAbstractButtonLineEdit {
    Q_OBJECT
    class QColorLineEditPrivate *d;

    Q_PROPERTY(QLineEdit::ActionPosition embededActionPosition READ embededActionPosition WRITE setEmbededActionPosition
                   NOTIFY embededActionPositionChanged)
    Q_PROPERTY(QColor color READ color WRITE setColor USER true NOTIFY colorChanged)
    Q_PROPERTY(QString caption READ caption WRITE setCaption)
    Q_PROPERTY(QColorAction::ColorDialogOptions options READ options WRITE setOptions)

public:
    explicit QColorLineEdit(QWidget *parent = nullptr);
    explicit QColorLineEdit(const QColor &color, QWidget *parent = nullptr);
    explicit QColorLineEdit(const QString &colorName, QWidget *parent = nullptr);

    QLineEdit::ActionPosition embededActionPosition() const;
    void setEmbededActionPosition(QLineEdit::ActionPosition position);

    QColor color() const;
    void setColor(const QColor &color);

    QString caption() const;
    void setCaption(const QString &caption);

    QColorAction::ColorDialogOptions options() const;
    void setOptions(QColorAction::ColorDialogOptions options);

Q_SIGNALS:
    void embededActionPositionChanged(QLineEdit::ActionPosition position);
    void colorChanged(const QColor &color);
}